

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
HecrSequential_computeLinearSystemSize_Test::TestBody
          (HecrSequential_computeLinearSystemSize_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_c0;
  Message local_b8;
  int local_b0 [2];
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_3;
  Message local_90;
  int local_88 [2];
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  int local_60 [2];
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40 [3];
  int local_28 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  HecrSequential_computeLinearSystemSize_Test *this_local;
  
  local_28[1] = 1;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_28[0] = compute_linear_system_size(1);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_20,"1","compute_linear_system_size(1)",local_28 + 1,local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_60[1] = 7;
  local_60[0] = compute_linear_system_size(4);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_58,"7","compute_linear_system_size(4)",local_60 + 1,local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_88[1] = 7;
  local_88[0] = compute_linear_system_size(7);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_80,"7","compute_linear_system_size(7)",local_88 + 1,local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_b0[1] = 0xf;
  local_b0[0] = compute_linear_system_size(8);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_a8,"15","compute_linear_system_size(8)",local_b0 + 1,local_b0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  return;
}

Assistant:

TEST(HecrSequential, computeLinearSystemSize)
{
    EXPECT_EQ(1, compute_linear_system_size(1));
    EXPECT_EQ(7, compute_linear_system_size(4));
    EXPECT_EQ(7, compute_linear_system_size(7));
    EXPECT_EQ(15, compute_linear_system_size(8));
}